

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::BlendShapeChannel::BlendShapeChannel
          (BlendShapeChannel *this,uint64_t id,Element *element,Document *doc,string *name)

{
  Scope *this_00;
  Element *pEVar1;
  Token *t;
  _Alloc_hider _Var2;
  float fVar3;
  ShapeGeometry *sg;
  ShapeGeometry *local_68;
  string local_60;
  WeightArray *local_40;
  BlendShapeChannel *local_38;
  
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShapeChannel_007f8d48;
  local_40 = &this->fullWeights;
  (this->fullWeights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fullWeights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fullWeights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shapeGeometries).
  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shapeGeometries).
  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shapeGeometries).
  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  this_00 = GetRequiredScope(element);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"DeformPercent",(allocator<char> *)&local_68);
  pEVar1 = Scope::operator[](this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pEVar1 != (Element *)0x0) {
    t = GetRequiredToken(pEVar1,0);
    fVar3 = ParseTokenAsFloat(t);
    this->percent = fVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"FullWeights",(allocator<char> *)&local_68);
  pEVar1 = Scope::operator[](this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pEVar1 != (Element *)0x0) {
    ParseVectorDataArray(local_40,pEVar1);
  }
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_60,doc,(this->super_Deformer).super_Object.id,"Geometry");
  std::
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>::
  reserve(&this->shapeGeometries,
          (long)(local_60._M_string_length - (long)local_60._M_dataplus._M_p) >> 3);
  for (_Var2._M_p = local_60._M_dataplus._M_p; _Var2._M_p != (pointer)local_60._M_string_length;
      _Var2._M_p = _Var2._M_p + 8) {
    local_68 = Util::ProcessSimpleConnection<Assimp::FBX::ShapeGeometry>
                         (*(Connection **)_Var2._M_p,false,"Shape -> BlendShapeChannel",element,
                          (char **)0x0);
    if (local_68 != (ShapeGeometry *)0x0) {
      std::
      vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
      ::push_back(&this->shapeGeometries,&local_68);
    }
  }
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base((_Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&local_60);
  return;
}

Assistant:

BlendShapeChannel::BlendShapeChannel(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Deformer(id, element, doc, name)
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const DeformPercent = sc["DeformPercent"];
    if (DeformPercent) {
        percent = ParseTokenAsFloat(GetRequiredToken(*DeformPercent, 0));
    }
    const Element* const FullWeights = sc["FullWeights"];
    if (FullWeights) {
        ParseVectorDataArray(fullWeights, *FullWeights);
    }
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(), "Geometry");
    shapeGeometries.reserve(conns.size());
    for (const Connection* con : conns) {
        const ShapeGeometry* const sg = ProcessSimpleConnection<ShapeGeometry>(*con, false, "Shape -> BlendShapeChannel", element);
        if (sg) {
            shapeGeometries.push_back(sg);
            continue;
        }
    }
}